

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.hpp
# Opt level: O0

double TasGrid::MultiIndexManipulations::getIndexWeight<double,(TasGrid::TypeDepth)2>
                 (int *index,
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *cache)

{
  size_type sVar1;
  const_reference this;
  const_reference pvVar2;
  ulong local_28;
  size_t j;
  double w;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *cache_local;
  int *index_local;
  
  j = 0;
  local_28 = 0;
  while( true ) {
    sVar1 = ::std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(cache);
    if (sVar1 <= local_28) break;
    this = ::std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](cache,local_28);
    pvVar2 = ::std::vector<double,_std::allocator<double>_>::operator[](this,(long)index[local_28]);
    j = (size_t)(*pvVar2 + (double)j);
    local_28 = local_28 + 1;
  }
  return (double)j;
}

Assistant:

inline CacheType getIndexWeight(int const index[], std::vector<std::vector<CacheType>> const &cache){
    CacheType w = (contour == type_hyperbolic) ? 1 : 0;
    for(size_t j=0; j<cache.size(); j++)
        if (contour == type_hyperbolic)
            w *= cache[j][index[j]];
        else
            w += cache[j][index[j]];
    return w;
}